

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O1

ASN1_TIME * X509_time_adj_ex(ASN1_TIME *s,int offset_day,long offset_sec,time_t *t)

{
  time_t t_00;
  ASN1_TIME *pAVar1;
  
  if (t == (time_t *)0x0) {
    t_00 = time((time_t *)0x0);
  }
  else {
    t_00 = *t;
  }
  pAVar1 = ASN1_TIME_adj(s,t_00,offset_day,offset_sec);
  return pAVar1;
}

Assistant:

ASN1_TIME *X509_time_adj_ex(ASN1_TIME *s, int offset_day, long offset_sec,
                            const time_t *in_tm) {
  int64_t t = 0;

  if (in_tm) {
    t = *in_tm;
  } else {
    t = time(NULL);
  }

  return ASN1_TIME_adj(s, t, offset_day, offset_sec);
}